

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vertex.cpp
# Opt level: O0

void __thiscall Vertex::mutateVertex(Vertex *this)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  undefined1 *puVar5;
  int local_60;
  int local_5c;
  int j_1;
  int i_1;
  int local_44;
  int local_40;
  int j;
  int i;
  int count;
  int min;
  int min_index;
  string temp_seq;
  Vertex *this_local;
  
  std::__cxx11::string::string((string *)&min,(string *)&this->seq);
  if (this->treshhold < 6) {
    bVar1 = false;
    for (local_5c = 0; iVar2 = std::__cxx11::string::size(), local_5c < iVar2;
        local_5c = local_5c + 1) {
      i = this->quality;
      count = -1;
      local_60 = 0;
      while ((sVar3 = std::vector<int,_std::allocator<int>_>::size(&this->qual_list),
             local_60 < (int)sVar3 && (!bVar1))) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->qual_list,(long)local_60)
        ;
        if (*pvVar4 < i) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&this->qual_list,(long)local_60);
          i = *pvVar4;
          count = local_60;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&this->qual_list,(long)local_60);
          *pvVar4 = 100;
        }
        local_60 = local_60 + 1;
      }
      if (bVar1) break;
      if (count != -1) {
        puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)&min);
        *puVar5 = 0x58;
        bVar1 = true;
      }
    }
    std::__cxx11::string::operator=((string *)&this->seq_del,(string *)&min);
  }
  else {
    j = 0;
    for (local_40 = 0; iVar2 = std::__cxx11::string::size(), local_40 < iVar2;
        local_40 = local_40 + 1) {
      i = this->quality;
      count = -1;
      local_44 = 0;
      while ((sVar3 = std::vector<int,_std::allocator<int>_>::size(&this->qual_list),
             local_44 < (int)sVar3 && (j != 2))) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->qual_list,(long)local_44)
        ;
        if (*pvVar4 < i) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&this->qual_list,(long)local_44);
          i = *pvVar4;
          count = local_44;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&this->qual_list,(long)local_44);
          *pvVar4 = 100;
        }
        local_44 = local_44 + 1;
      }
      if (j == 2) break;
      if (count != -1) {
        puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)&min);
        *puVar5 = 0x58;
        j = j + 1;
      }
    }
    std::__cxx11::string::operator=((string *)&this->seq_del,(string *)&min);
  }
  std::__cxx11::string::~string((string *)&min);
  return;
}

Assistant:

void Vertex::mutateVertex(){
    string temp_seq = this->seq;
    int min_index = 0, min = 0, count = 0;
    if(this->treshhold > 5){
        count = 0;
        for(int i = 0; i < (int)this->seq.size(); i++){
            min = this->quality, min_index = -1;
            for(int j = 0; j < (int)this->qual_list.size(); j++){
                if(count == 2)
                    break;
                if(this->qual_list[j] < min){
                    min = this->qual_list[j];
                    min_index = j;
                    this->qual_list[j] = 100;
                }
            }
            if(count == 2)
                break;
            if(min_index == -1)
                continue;
            temp_seq[min_index] = 'X';
            count++;
        }
        this->seq_del = temp_seq;
        return void();
    }else{
        count = 0;
        for(int i = 0; i < (int)this->seq.size(); i++){
            min = this->quality, min_index = -1;
            for(int j = 0; j < (int)this->qual_list.size(); j++){
                if(count)
                    break;
                if(this->qual_list[j] < min){
                    min = this->qual_list[j];
                    min_index = j;
                    this->qual_list[j] = 100;
                }
            }
            if(count)
                break;
            if(min_index == -1)
                continue;
            temp_seq[min_index] = 'X';
            count++;
        }
    }
    this->seq_del = temp_seq;
    return void();
}